

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::ArgumentParser::ArgumentParser(ArgumentParser *this,string *aProgramName)

{
  Argument *pAVar1;
  bool local_79;
  any local_78;
  bool local_61;
  any local_60;
  allocator<char> local_49;
  string local_48;
  string *local_18;
  string *aProgramName_local;
  ArgumentParser *this_local;
  
  local_18 = aProgramName;
  aProgramName_local = &this->mProgramName;
  std::__cxx11::string::string((string *)this,aProgramName);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::list
            (&this->mPositionalArguments);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::list
            (&this->mOptionalArguments);
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::map(&this->mArgumentMap);
  pAVar1 = add_argument<char_const*,char_const*>(this,"-h","--help");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show this help message and exit",&local_49);
  pAVar1 = Argument::help(pAVar1,&local_48);
  pAVar1 = Argument::nargs(pAVar1,0);
  local_61 = false;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_60,&local_61);
  pAVar1 = Argument::default_value(pAVar1,&local_60);
  local_79 = true;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_78,&local_79);
  Argument::implicit_value(pAVar1,&local_78);
  std::any::~any(&local_78);
  std::any::~any(&local_60);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {})
      : mProgramName(std::move(aProgramName)) {
    add_argument(Argument::mHelpOption, Argument::mHelpOptionLong)
        .help("show this help message and exit")
        .nargs(0)
        .default_value(false)
        .implicit_value(true);
  }